

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsInputSetDefaultTime(HelicsInput inp,HelicsTime val,HelicsError *err)

{
  HelicsInput pvVar1;
  long local_8;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (inp == (HelicsInput)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a9ad1;
    }
    else {
      pvVar1 = (HelicsInput)0x0;
      if (*inp == 0x3456e052) {
        pvVar1 = inp;
      }
      if (*inp == 0x3456e052 || err == (HelicsError *)0x0) goto LAB_001a9ad3;
    }
    err->error_code = -3;
    err->message = "The given input object does not point to a valid object";
  }
LAB_001a9ad1:
  pvVar1 = (HelicsInput)0x0;
LAB_001a9ad3:
  if (pvVar1 != (HelicsInput)0x0) {
    local_8 = 0x7fffffffffffffff;
    if (val <= -9223372036.854765) {
      local_8 = -0x7fffffffffffffff;
    }
    else if (val < 9223372036.854765) {
      local_8 = (long)(val * 1000000000.0 +
                      *(double *)(&DAT_00436020 + (ulong)(0.0 <= val * 1000000000.0) * 8));
    }
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)(*(long *)((long)pvVar1 + 0x18) + 0x70),&local_8);
  }
  return;
}

Assistant:

helics::InputObject* verifyInput(HelicsInput inp, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    if (inp == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidInputString);
        return nullptr;
    }
    auto* inpObj = reinterpret_cast<helics::InputObject*>(inp);
    if (inpObj->valid != InputValidationIdentifier) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidInputString);
        return nullptr;
    }
    return inpObj;
}